

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlAddSibling(xmlNodePtr cur,xmlNodePtr elem)

{
  _xmlNode *p_Var1;
  xmlNodePtr parent;
  xmlNodePtr elem_local;
  xmlNodePtr cur_local;
  
  if ((cur == (xmlNodePtr)0x0) || (cur->type == XML_NAMESPACE_DECL)) {
    cur_local = (xmlNodePtr)0x0;
  }
  else if ((elem == (xmlNodePtr)0x0) || (elem->type == XML_NAMESPACE_DECL)) {
    cur_local = (xmlNodePtr)0x0;
  }
  else if (cur == elem) {
    cur_local = (xmlNodePtr)0x0;
  }
  else {
    elem_local = cur;
    if ((((cur->type == XML_ATTRIBUTE_NODE) || (cur->parent == (_xmlNode *)0x0)) ||
        (cur->parent->children == (_xmlNode *)0x0)) ||
       ((cur->parent->last == (_xmlNode *)0x0 || (cur->parent->last->next != (_xmlNode *)0x0)))) {
      for (; elem_local->next != (_xmlNode *)0x0; elem_local = elem_local->next) {
      }
    }
    else {
      elem_local = cur->parent->last;
    }
    xmlUnlinkNode(elem);
    if (((elem_local->type == XML_TEXT_NODE) && (elem->type == XML_TEXT_NODE)) &&
       (elem_local->name == elem->name)) {
      xmlNodeAddContent(elem_local,elem->content);
      xmlFreeNode(elem);
      cur_local = elem_local;
    }
    else if (elem->type == XML_ATTRIBUTE_NODE) {
      cur_local = xmlAddPropSibling(elem_local,elem_local,elem);
    }
    else {
      if (elem->doc != elem_local->doc) {
        xmlSetTreeDoc(elem,elem_local->doc);
      }
      p_Var1 = elem_local->parent;
      elem->prev = elem_local;
      elem->next = (_xmlNode *)0x0;
      elem->parent = p_Var1;
      elem_local->next = elem;
      cur_local = elem;
      if (p_Var1 != (_xmlNode *)0x0) {
        p_Var1->last = elem;
      }
    }
  }
  return cur_local;
}

Assistant:

xmlNodePtr
xmlAddSibling(xmlNodePtr cur, xmlNodePtr elem) {
    xmlNodePtr parent;

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddSibling : cur == NULL\n");
#endif
	return(NULL);
    }

    if ((elem == NULL) || (elem->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddSibling : elem == NULL\n");
#endif
	return(NULL);
    }

    if (cur == elem) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddSibling : cur == elem\n");
#endif
	return(NULL);
    }

    /*
     * Constant time is we can rely on the ->parent->last to find
     * the last sibling.
     */
    if ((cur->type != XML_ATTRIBUTE_NODE) && (cur->parent != NULL) &&
	(cur->parent->children != NULL) &&
	(cur->parent->last != NULL) &&
	(cur->parent->last->next == NULL)) {
	cur = cur->parent->last;
    } else {
	while (cur->next != NULL) cur = cur->next;
    }

    xmlUnlinkNode(elem);

    if ((cur->type == XML_TEXT_NODE) && (elem->type == XML_TEXT_NODE) &&
        (cur->name == elem->name)) {
	xmlNodeAddContent(cur, elem->content);
	xmlFreeNode(elem);
	return(cur);
    } else if (elem->type == XML_ATTRIBUTE_NODE) {
		return xmlAddPropSibling(cur, cur, elem);
    }

    if (elem->doc != cur->doc) {
	xmlSetTreeDoc(elem, cur->doc);
    }
    parent = cur->parent;
    elem->prev = cur;
    elem->next = NULL;
    elem->parent = parent;
    cur->next = elem;
    if (parent != NULL)
	parent->last = elem;

    return(elem);
}